

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server2.cpp
# Opt level: O1

int sendMessage(string *cmd,int new_fd,string *currUser,
               vector<cUser,_std::allocator<cUser>_> *currUsers,bool *msgFlags,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *msgs)

{
  _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
  *this;
  pointer pcVar1;
  anon_struct_40_2_6a8bb0e8 *paVar2;
  pointer paVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  ssize_t sVar7;
  size_type *psVar8;
  ulong *puVar9;
  size_type *psVar10;
  pointer paVar11;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it;
  __normal_iterator<cUser_*,_std::vector<cUser,_std::allocator<cUser>_>_> __it_00;
  long lVar12;
  size_type *psVar13;
  bool bVar14;
  size_type *local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  long local_118;
  undefined1 local_110 [16];
  undefined1 *local_100;
  string username;
  char *local_d0;
  string msg;
  ulong *local_a0;
  pointer local_98;
  ulong local_90;
  size_type sStack_88;
  string *local_80;
  size_type *local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cUser user;
  
  username.field_2._8_8_ = msgs;
  local_80 = currUser;
  std::__cxx11::string::find((char *)cmd,0x1091e5,0);
  std::__cxx11::string::substr((ulong)&local_100,(ulong)cmd);
  std::__cxx11::string::substr((ulong)&local_d0,(ulong)cmd);
  psVar13 = &user.username._M_string_length;
  __str.field_2._8_8_ = psVar13;
  std::__cxx11::string::_M_construct<char_const*>((string *)((long)&__str.field_2 + 8),"all","");
  if (username._M_dataplus._M_p == user.username._M_dataplus._M_p) {
    if (username._M_dataplus._M_p == (pointer)0x0) {
      bVar14 = true;
    }
    else {
      iVar4 = bcmp(local_100,(void *)__str.field_2._8_8_,(size_t)username._M_dataplus._M_p);
      bVar14 = iVar4 == 0;
    }
  }
  else {
    bVar14 = false;
  }
  if ((size_type *)__str.field_2._8_8_ != psVar13) {
    operator_delete((void *)__str.field_2._8_8_);
  }
  if (bVar14) {
    pcVar1 = (local_80->_M_dataplus)._M_p;
    local_78 = &__str._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + local_80->_M_string_length);
    std::__cxx11::string::append((char *)&local_78);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d0);
    psVar13 = &user.username._M_string_length;
    psVar8 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar8) {
      user.username._M_string_length = *psVar8;
      user.username.field_2._M_allocated_capacity = plVar5[3];
      __str.field_2._8_8_ = psVar13;
    }
    else {
      user.username._M_string_length = *psVar8;
      __str.field_2._8_8_ = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)(__str.field_2._M_local_buf + 8));
    if ((size_type *)__str.field_2._8_8_ != psVar13) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_78 != &__str._M_string_length) {
      operator_delete(local_78);
    }
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_d0,(long)msg._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    paVar11 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
              super__Vector_impl_data._M_start;
    paVar3 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    iVar4 = 1;
    if (paVar11 == paVar3) goto LAB_00107833;
    do {
      __str.field_2._8_8_ = &user.username._M_string_length;
      pcVar1 = (paVar11->username)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)((long)&__str.field_2 + 8),pcVar1,
                 pcVar1 + (paVar11->username)._M_string_length);
      user.username.field_2._8_4_ = paVar11->id;
      lVar12 = (long)(int)user.username.field_2._8_4_;
      if ((user.username._M_dataplus._M_p != (pointer)local_80->_M_string_length) ||
         ((user.username._M_dataplus._M_p != (pointer)0x0 &&
          (iVar4 = bcmp((void *)__str.field_2._8_8_,(local_80->_M_dataplus)._M_p,
                        (size_t)user.username._M_dataplus._M_p), iVar4 != 0)))) {
        std::__cxx11::string::_M_assign((string *)(lVar12 * 0x20 + *(long *)username.field_2._8_8_))
        ;
        msgFlags[(int)user.username.field_2._8_4_] = true;
      }
      if ((size_type *)__str.field_2._8_8_ != &user.username._M_string_length) {
        operator_delete((void *)__str.field_2._8_8_);
      }
      paVar11 = paVar11 + 1;
    } while (paVar11 != paVar3);
  }
  else {
    __it_00._M_current =
         (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
         super__Vector_impl_data._M_start;
    paVar2 = (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    __str_1.field_2._8_8_ = local_110;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str_1.field_2 + 8),local_100,
               username._M_dataplus._M_p + (long)local_100);
    local_a0 = &local_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a0,__str_1.field_2._8_8_,local_118 + __str_1.field_2._8_8_);
    __str._M_string_length = local_90;
    __str._M_dataplus._M_p = local_98;
    if (local_a0 == &local_90) {
      user.username.field_2._M_allocated_capacity = sStack_88;
      __str.field_2._8_8_ = psVar13;
    }
    else {
      __str.field_2._8_8_ = local_a0;
    }
    user.username._M_string_length = local_90;
    user.username._M_dataplus._M_p = local_98;
    local_98 = (pointer)0x0;
    local_90 = local_90 & 0xffffffffffffff00;
    local_78 = &__str._M_string_length;
    if ((size_type *)__str.field_2._8_8_ == psVar13) {
      __str.field_2._M_allocated_capacity = user.username.field_2._M_allocated_capacity;
    }
    else {
      local_78 = (size_type *)__str.field_2._8_8_;
    }
    msg.field_2._12_4_ = new_fd;
    local_a0 = &local_90;
    __str.field_2._8_8_ = psVar13;
    std::__cxx11::string::_M_construct<char*>
              ((string *)((long)&__str.field_2 + 8),local_78,__str._M_dataplus._M_p + (long)local_78
              );
    lVar12 = ((long)paVar2 - (long)__it_00._M_current >> 3) * -0x3333333333333333 >> 2;
    if (0 < lVar12) {
      lVar12 = lVar12 + 1;
      this = (_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
              *)(__str.field_2._M_local_buf + 8);
      do {
        bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()(this,__it_00);
        __it._M_current = __it_00._M_current;
        if (bVar14) goto LAB_001074f6;
        bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()(this,__it_00._M_current + 1);
        __it._M_current = __it_00._M_current + 1;
        if (bVar14) goto LAB_001074f6;
        bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()(this,__it_00._M_current + 2);
        __it._M_current = __it_00._M_current + 2;
        if (bVar14) goto LAB_001074f6;
        bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()(this,__it_00._M_current + 3);
        __it._M_current = __it_00._M_current + 3;
        if (bVar14) goto LAB_001074f6;
        __it_00._M_current = __it_00._M_current + 4;
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    lVar12 = ((long)paVar2 - (long)__it_00._M_current >> 3) * -0x3333333333333333;
    if (lVar12 == 1) {
LAB_001074dd:
      bVar14 = __gnu_cxx::__ops::
               _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
               ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                             *)(__str.field_2._M_local_buf + 8),__it_00);
      __it._M_current = paVar2;
      if (bVar14) {
        __it._M_current = __it_00._M_current;
      }
    }
    else {
      __it._M_current = __it_00._M_current;
      if (lVar12 == 2) {
LAB_00107359:
        bVar14 = __gnu_cxx::__ops::
                 _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                 ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                               *)(__str.field_2._M_local_buf + 8),__it);
        if (!bVar14) {
          __it_00._M_current = __it._M_current + 1;
          goto LAB_001074dd;
        }
      }
      else {
        __it._M_current = paVar2;
        if ((lVar12 == 3) &&
           (bVar14 = __gnu_cxx::__ops::
                     _Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::$_0>
                     ::operator()((_Iter_pred<sendMessage(std::__cxx11::string,int,std::__cxx11::string_const&,std::vector<cUser,std::allocator<cUser>>&,bool*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)::__0>
                                   *)(__str.field_2._M_local_buf + 8),__it_00),
           __it._M_current = __it_00._M_current, !bVar14)) {
          __it._M_current = __it_00._M_current + 1;
          goto LAB_00107359;
        }
      }
    }
LAB_001074f6:
    psVar13 = &user.username._M_string_length;
    if ((size_type *)__str.field_2._8_8_ != psVar13) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_78 != &__str._M_string_length) {
      operator_delete(local_78);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if ((undefined1 *)__str_1.field_2._8_8_ != local_110) {
      operator_delete((void *)__str_1.field_2._8_8_);
    }
    if (__it._M_current ==
        (currUsers->super__Vector_base<cUser,_std::allocator<cUser>_>)._M_impl.
        super__Vector_impl_data._M_finish) {
      sVar7 = send(msg.field_2._12_4_,"Invalid UserID to send message",0x20,0);
      iVar4 = 0;
      if (sVar7 == -1) {
        perror("Another send error bro");
        iVar4 = 0;
      }
      goto LAB_00107833;
    }
    pcVar1 = (local_80->_M_dataplus)._M_p;
    local_140 = &__str_1._M_string_length;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_140,pcVar1,pcVar1 + local_80->_M_string_length);
    std::__cxx11::string::append((char *)&local_140);
    psVar8 = &__str._M_string_length;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_140,(ulong)local_100);
    local_a0 = &local_90;
    puVar9 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar9) {
      local_90 = *puVar9;
      sStack_88 = plVar5[3];
    }
    else {
      local_90 = *puVar9;
      local_a0 = (ulong *)*plVar5;
    }
    local_98 = (pointer)plVar5[1];
    *plVar5 = (long)puVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_a0);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      __str._M_string_length = *psVar10;
      __str.field_2._M_allocated_capacity = plVar5[3];
      local_78 = psVar8;
    }
    else {
      __str._M_string_length = *psVar10;
      local_78 = (size_type *)*plVar5;
    }
    __str._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d0);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      user.username._M_string_length = *psVar10;
      user.username.field_2._M_allocated_capacity = plVar5[3];
      __str.field_2._8_8_ = psVar13;
    }
    else {
      user.username._M_string_length = *psVar10;
      __str.field_2._8_8_ = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)__str.field_2._8_8_,
                        (long)user.username._M_dataplus._M_p);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
    std::ostream::put((char)poVar6);
    std::ostream::flush();
    if ((size_type *)__str.field_2._8_8_ != psVar13) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_78 != psVar8) {
      operator_delete(local_78);
    }
    if (local_a0 != &local_90) {
      operator_delete(local_a0);
    }
    if (local_140 != &__str_1._M_string_length) {
      operator_delete(local_140);
    }
    pcVar1 = (local_80->_M_dataplus)._M_p;
    local_78 = psVar8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_78,pcVar1,pcVar1 + local_80->_M_string_length);
    std::__cxx11::string::append((char *)&local_78);
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_d0);
    psVar10 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar10) {
      user.username._M_string_length = *psVar10;
      user.username.field_2._M_allocated_capacity = plVar5[3];
      __str.field_2._8_8_ = psVar13;
    }
    else {
      user.username._M_string_length = *psVar10;
      __str.field_2._8_8_ = (size_type *)*plVar5;
    }
    user.username._M_dataplus._M_p = (pointer)plVar5[1];
    *plVar5 = (long)psVar10;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_d0,(string *)(__str.field_2._M_local_buf + 8));
    if ((size_type *)__str.field_2._8_8_ != psVar13) {
      operator_delete((void *)__str.field_2._8_8_);
    }
    if (local_78 != psVar8) {
      operator_delete(local_78);
    }
    std::__cxx11::string::_M_assign
              ((string *)((long)(__it._M_current)->id * 0x20 + *(long *)username.field_2._8_8_));
    msgFlags[(__it._M_current)->id] = true;
  }
  iVar4 = 1;
LAB_00107833:
  if ((size_type *)local_d0 != &msg._M_string_length) {
    operator_delete(local_d0);
  }
  if ((size_type *)local_100 != &username._M_string_length) {
    operator_delete(local_100);
  }
  return iVar4;
}

Assistant:

int sendMessage(string cmd, int new_fd, const string& currUser, vector<cUser>& currUsers,
 bool* msgFlags, vector<string>& msgs){
    //find where the space is int he
    size_t spacePos = cmd.find(" ");
    //pull out the username to send the message to
    string username = cmd.substr(0,spacePos);
    // pull out th message from the command string
    string msg = cmd.substr(spacePos+1);


    //handle the boadcast case
    if(username == string("all")){
        msg = currUser + ": " + msg;

        cout << msg << endl;

        //set all loged in users message flags and add the message to their queue
        for(cUser user : currUsers){
            if(user.username != currUser){
                msgs[user.id] = msg;
                msgFlags[user.id] = true;
            }
        }
        return 1;
    }

    // check if the message is being sent to a logged in user
    auto it = find_if(currUsers.begin(), currUsers.end(),[username](cUser u){
        return (u.username == username);
    });

    //if the user is logged in set the flag and add the message to their queue
    if(it != currUsers.end()){

        cout << currUser + " (to " + username + "): " + msg << endl;

        msg = currUser + ": " + msg;
        msgs[it->id] = msg;
        msgFlags[it->id] = true;

        return 1;
    }

    //send and error if the user is not logged in
    if(send(new_fd, "Invalid UserID to send message", 32, 0) == -1)
        perror("Another send error bro");

    return 0;
}